

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.hpp
# Opt level: O0

void __thiscall
pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
          (transaction<std::unique_lock<mock_mutex>_> *this,database *db,lock_type *lock)

{
  bool bVar1;
  lock_type *lock_local;
  database *db_local;
  transaction<std::unique_lock<mock_mutex>_> *this_local;
  
  transaction_base::transaction_base(&this->super_transaction_base,db);
  (this->super_transaction_base)._vptr_transaction_base = (_func_int **)&PTR__transaction_002ec710;
  std::unique_lock<mock_mutex>::unique_lock(&this->lock_,lock);
  bVar1 = transaction_base::is_open(&this->super_transaction_base);
  if (!bVar1) {
    return;
  }
  assert_failed("!this->is_open ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/transaction.hpp"
                ,0xd7);
}

Assistant:

transaction<LockGuard>::transaction (database & db, LockGuard && lock)
            : transaction_base (db)
            , lock_{std::move (lock)} {

        PSTORE_ASSERT (!this->is_open ());
    }